

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O0

void pollAbsState(_GLFWjoystick *js)

{
  int iVar1;
  input_absinfo *piVar2;
  input_absinfo *info;
  int code;
  _GLFWjoystick *js_local;
  
  for (info._4_4_ = 0; info._4_4_ < 0x40; info._4_4_ = info._4_4_ + 1) {
    if (-1 < (js->linjs).absMap[info._4_4_]) {
      piVar2 = (js->linjs).absInfo + info._4_4_;
      iVar1 = ioctl((js->linjs).fd,(ulong)(info._4_4_ + 0x40U | 0x80004500) | 0x180000,piVar2);
      if (-1 < iVar1) {
        handleAbsEvent(js,info._4_4_,piVar2->value);
      }
    }
  }
  return;
}

Assistant:

static void pollAbsState(_GLFWjoystick* js)
{
    for (int code = 0;  code < ABS_CNT;  code++)
    {
        if (js->linjs.absMap[code] < 0)
            continue;

        struct input_absinfo* info = &js->linjs.absInfo[code];

        if (ioctl(js->linjs.fd, EVIOCGABS(code), info) < 0)
            continue;

        handleAbsEvent(js, code, info->value);
    }
}